

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcsFile.cpp
# Opt level: O1

void mcsFile::WriteSectorHeader(ofstream *file,uint num)

{
  ofstream *poVar1;
  long lVar2;
  long lVar3;
  ofstream oVar4;
  ostream *poVar5;
  
  lVar2 = *(long *)file;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(file + lVar3 + 0x18) = *(uint *)(file + lVar3 + 0x18) & 0xffffffb5 | 8;
  lVar2 = *(long *)(lVar2 + -0x18);
  poVar1 = file + lVar2;
  if (file[lVar2 + 0xe1] == (ofstream)0x0) {
    oVar4 = (ofstream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar4;
    poVar1[0xe1] = (ofstream)0x1;
  }
  poVar1[0xe0] = (ofstream)0x30;
  *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) | 0x4000;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,":",1);
  *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) =
       *(uint *)(file + *(long *)(*(long *)file + -0x18) + 0x18) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"02000004",8);
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 4;
  std::ostream::_M_insert<unsigned_long>((ulong)file);
  *(undefined8 *)(file + *(long *)(*(long *)file + -0x18) + 0x10) = 2;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)file);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void mcsFile::WriteSectorHeader(std::ofstream &file, unsigned int num)
{
    file << std::hex << std::setfill('0') << std::uppercase;
    file << ":" << std::hex << "02000004";
    unsigned long csum_computed = 0x02 + 0x04;
    file << std::setw(4) << static_cast<unsigned short>(num);
    csum_computed += num&0x000000ff;
    csum_computed += (num&0x0000ff00)>>8;
    csum_computed = (~csum_computed+1)&0x000000ff;
    file << std::setw(2) << csum_computed << std::endl;
}